

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

void __thiscall TBSCertList::TBSCertList(TBSCertList *this,TBSCertList *param_1)

{
  (this->super_DerBase).cbData = (param_1->super_DerBase).cbData;
  (this->super_DerBase)._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00145e80;
  Integer::Integer(&this->version,&param_1->version);
  AlgorithmIdentifier::AlgorithmIdentifier(&this->signature,&param_1->signature);
  Name::Name(&this->issuer,&param_1->issuer);
  Time::Time(&this->thisUpdate,&param_1->thisUpdate);
  Time::Time(&this->nextUpdate,&param_1->nextUpdate);
  RevokedCertificates::RevokedCertificates(&this->revokedCertificates,&param_1->revokedCertificates)
  ;
  ContextSpecificHolder<Extensions,_(unsigned_char)'\xa0',_(OptionType)1>::ContextSpecificHolder
            (&this->crlExtensions,&param_1->crlExtensions);
  return;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData =
			version.EncodedSize() +
			signature.EncodedSize() +
			issuer.EncodedSize() +
			thisUpdate.EncodedSize() +
			nextUpdate.EncodedSize() +
			revokedCertificates.EncodedSize() +
			crlExtensions.EncodedSize();

		return cbData;
	}